

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O0

void cfl_predict_hbd_ssse3
               (int16_t *pred_buf_q3,uint16_t *dst,int dst_stride,int alpha_q3,int bd,int width,
               int height)

{
  __m128i dc_q0_00;
  __m128i dc_q0_01;
  __m128i dc_q0_02;
  __m128i dc_q0_03;
  undefined2 in_CX;
  long lVar1;
  int in_EDX;
  long *in_RSI;
  long *plVar2;
  __m128i *in_RDI;
  __m128i *palVar3;
  longlong in_R8;
  int iVar4;
  longlong in_R9;
  long extraout_XMM0_Qa;
  long extraout_XMM0_Qa_00;
  long extraout_XMM0_Qa_01;
  long extraout_XMM0_Qa_02;
  undefined1 auVar5 [16];
  long extraout_XMM0_Qb;
  long extraout_XMM0_Qb_00;
  long extraout_XMM0_Qb_01;
  long extraout_XMM0_Qb_02;
  __m128i alVar6;
  __m128i alpha_sign_00;
  __m128i alpha_sign_01;
  __m128i alpha_sign_02;
  __m128i alpha_sign_03;
  __m128i alpha_q12_00;
  __m128i alpha_q12_01;
  __m128i alpha_q12_02;
  __m128i u;
  __m128i u_00;
  __m128i u_01;
  __m128i u_02;
  __m128i zero;
  __m128i zero_00;
  __m128i zero_01;
  __m128i zero_02;
  __m128i max_00;
  __m128i max_01;
  __m128i max_02;
  __m128i max_03;
  int in_stack_00000008;
  __m128i res_3;
  __m128i res_2;
  __m128i res_1;
  __m128i res;
  __m128i *row_end;
  __m128i *row;
  __m128i zeros;
  __m128i max;
  __m128i dc_q0;
  __m128i alpha_q12;
  __m128i alpha_sign;
  long *in_stack_fffffffffffffde8;
  long *in_stack_fffffffffffffdf0;
  __m128i *local_1b0;
  long *local_148;
  
  iVar4 = (int)in_R9;
  auVar5._2_2_ = in_CX;
  auVar5._0_2_ = in_CX;
  auVar5._4_2_ = in_CX;
  auVar5._6_2_ = in_CX;
  auVar5._10_2_ = in_CX;
  auVar5._8_2_ = in_CX;
  auVar5._12_2_ = in_CX;
  auVar5._14_2_ = in_CX;
  auVar5 = pabsw(auVar5,auVar5);
  psllw(auVar5,ZEXT416(9));
  plVar2 = in_RSI;
  alVar6 = highbd_max_epi16((int)in_R8);
  lVar1 = (long)(in_stack_00000008 << 2) * 0x10;
  local_1b0 = in_RDI;
  local_148 = in_RSI;
  do {
    dc_q0_00[1] = (longlong)in_stack_fffffffffffffdf0;
    dc_q0_00[0] = (longlong)in_stack_fffffffffffffde8;
    alpha_sign_00[1] = in_R8;
    alpha_sign_00[0] = lVar1;
    alpha_q12_00[1] = alVar6[1];
    alpha_q12_00[0] = (longlong)plVar2;
    palVar3 = local_1b0;
    alVar6 = predict_unclipped(local_1b0,alpha_q12_00,alpha_sign_00,dc_q0_00);
    zero[0] = alVar6[1];
    u[1] = (longlong)plVar2;
    u[0] = (longlong)palVar3;
    zero[1] = lVar1;
    max_00[1] = in_R9;
    max_00[0] = in_R8;
    alVar6 = highbd_clamp_epi16(u,zero,max_00);
    if (iVar4 == 4) {
      *local_148 = extraout_XMM0_Qa;
      lVar1 = extraout_XMM0_Qa;
    }
    else {
      *local_148 = extraout_XMM0_Qa;
      local_148[1] = extraout_XMM0_Qb;
    }
    if (0xf < iVar4) {
      palVar3 = local_1b0 + 1;
      dc_q0_01[1] = (longlong)in_stack_fffffffffffffdf0;
      dc_q0_01[0] = (longlong)in_stack_fffffffffffffde8;
      alpha_sign_01[1] = in_R8;
      alpha_sign_01[0] = lVar1;
      alVar6[0] = (longlong)plVar2;
      alVar6 = predict_unclipped(palVar3,alVar6,alpha_sign_01,dc_q0_01);
      zero_00[0] = alVar6[1];
      u_00[1] = (longlong)plVar2;
      u_00[0] = (longlong)palVar3;
      zero_00[1] = lVar1;
      max_01[1] = in_R9;
      max_01[0] = in_R8;
      alVar6 = highbd_clamp_epi16(u_00,zero_00,max_01);
      local_148[2] = extraout_XMM0_Qa_00;
      local_148[3] = extraout_XMM0_Qb_00;
    }
    if (iVar4 == 0x20) {
      palVar3 = local_1b0 + 2;
      dc_q0_02[1] = (longlong)in_stack_fffffffffffffdf0;
      dc_q0_02[0] = (longlong)in_stack_fffffffffffffde8;
      alpha_sign_02[1] = in_R8;
      alpha_sign_02[0] = lVar1;
      alpha_q12_01[1] = alVar6[1];
      alpha_q12_01[0] = (longlong)plVar2;
      alVar6 = predict_unclipped(palVar3,alpha_q12_01,alpha_sign_02,dc_q0_02);
      zero_01[0] = alVar6[1];
      in_stack_fffffffffffffde8 = local_148 + 4;
      u_01[1] = (longlong)plVar2;
      u_01[0] = (longlong)palVar3;
      zero_01[1] = lVar1;
      max_02[1] = in_R9;
      max_02[0] = in_R8;
      alVar6 = highbd_clamp_epi16(u_01,zero_01,max_02);
      alpha_q12_02[1] = alVar6[1];
      *in_stack_fffffffffffffde8 = extraout_XMM0_Qa_01;
      in_stack_fffffffffffffde8[1] = extraout_XMM0_Qb_01;
      palVar3 = local_1b0 + 3;
      dc_q0_03[1] = (longlong)in_stack_fffffffffffffdf0;
      dc_q0_03[0] = (longlong)in_stack_fffffffffffffde8;
      alpha_sign_03[1] = in_R8;
      alpha_sign_03[0] = lVar1;
      alpha_q12_02[0] = (longlong)plVar2;
      alVar6 = predict_unclipped(palVar3,alpha_q12_02,alpha_sign_03,dc_q0_03);
      zero_02[0] = alVar6[1];
      in_stack_fffffffffffffdf0 = local_148 + 6;
      u_02[1] = (longlong)plVar2;
      u_02[0] = (longlong)palVar3;
      zero_02[1] = lVar1;
      max_03[1] = in_R9;
      max_03[0] = in_R8;
      alVar6 = highbd_clamp_epi16(u_02,zero_02,max_03);
      *in_stack_fffffffffffffdf0 = extraout_XMM0_Qa_02;
      in_stack_fffffffffffffdf0[1] = extraout_XMM0_Qb_02;
    }
    lVar1 = (long)in_EDX * 2;
    local_148 = (long *)((long)local_148 + lVar1);
    local_1b0 = local_1b0 + 4;
  } while (local_1b0 < in_RDI + (in_stack_00000008 << 2));
  return;
}

Assistant:

static inline void cfl_predict_hbd_ssse3(const int16_t *pred_buf_q3,
                                         uint16_t *dst, int dst_stride,
                                         int alpha_q3, int bd, int width,
                                         int height) {
  const __m128i alpha_sign = _mm_set1_epi16(alpha_q3);
  const __m128i alpha_q12 = _mm_slli_epi16(_mm_abs_epi16(alpha_sign), 9);
  const __m128i dc_q0 = _mm_set1_epi16(*dst);
  const __m128i max = highbd_max_epi16(bd);
  const __m128i zeros = _mm_setzero_si128();
  __m128i *row = (__m128i *)pred_buf_q3;
  const __m128i *row_end = row + height * CFL_BUF_LINE_I128;
  do {
    __m128i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    res = highbd_clamp_epi16(res, zeros, max);
    if (width == 4) {
      _mm_storel_epi64((__m128i *)dst, res);
    } else {
      _mm_storeu_si128((__m128i *)dst, res);
    }
    if (width >= 16) {
      const __m128i res_1 =
          predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128(((__m128i *)dst) + 1,
                       highbd_clamp_epi16(res_1, zeros, max));
    }
    if (width == 32) {
      const __m128i res_2 =
          predict_unclipped(row + 2, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128((__m128i *)(dst + 16),
                       highbd_clamp_epi16(res_2, zeros, max));
      const __m128i res_3 =
          predict_unclipped(row + 3, alpha_q12, alpha_sign, dc_q0);
      _mm_storeu_si128((__m128i *)(dst + 24),
                       highbd_clamp_epi16(res_3, zeros, max));
    }
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I128) < row_end);
}